

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::CMP_OP(SQVM *this,CmpOP op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *res)

{
  bool bVar1;
  bool b;
  SQInteger r;
  long local_20;
  
  bVar1 = ObjCmp(this,o1,o2,&local_20);
  if (bVar1) {
    switch(op) {
    case CMP_G:
      b = 0 < local_20;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqvm.cpp"
                    ,0x117,
                    "bool SQVM::CMP_OP(CmpOP, const SQObjectPtr &, const SQObjectPtr &, SQObjectPtr &)"
                   );
    case CMP_GE:
      b = -1 < local_20;
      break;
    case CMP_L:
      b = SUB81((ulong)local_20 >> 0x3f,0);
      break;
    case CMP_LE:
      b = local_20 < 1;
      break;
    case CMP_3W:
      SQObjectPtr::operator=(res,local_20);
      return bVar1;
    }
    SQObjectPtr::operator=(res,b);
  }
  return bVar1;
}

Assistant:

bool SQVM::CMP_OP(CmpOP op, const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &res)
{
    SQInteger r;
    if(ObjCmp(o1,o2,r)) {
        switch(op) {
            case CMP_G: res = (r > 0); return true;
            case CMP_GE: res = (r >= 0); return true;
            case CMP_L: res = (r < 0); return true;
            case CMP_LE: res = (r <= 0); return true;
            case CMP_3W: res = r; return true;
        }
        assert(0);
    }
    return false;
}